

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_netstd_struct_equals
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pcVar2;
  t_type *ptVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  t_netstd_generator *ptVar7;
  char *pcVar8;
  pointer pptVar9;
  string local_168;
  ostream *local_148;
  uint local_13c;
  string local_138;
  t_struct *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_118 = tstruct;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public override bool Equals(object that)",0x28);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (!(that is ",0xe);
  type_name_abi_cxx11_(&local_138,this,&local_118->super_t_type,false);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," other)) return false;",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"if (ReferenceEquals(this, other)) return true;",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  pptVar9 = (local_118->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (local_118->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_13c = (uint)CONCAT71((int7)((ulong)local_118 >> 8),1);
    local_148 = out;
    do {
      poVar5 = local_148;
      if ((local_13c & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_148,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"&& ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_148,local_168._M_dataplus._M_p,local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return ",7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        local_13c = 0;
      }
      if ((*pptVar9)->req_ != T_REQUIRED) {
        std::__ostream_insert<char,std::char_traits<char>>(local_148,"((__isset.",10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
        ptVar7 = this;
        normalize_name(&local_138,this,&local_90,false);
        get_isset_name(&local_168,ptVar7,&local_138);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_148,local_168._M_dataplus._M_p,local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," == other.__isset.",0x12);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
        ptVar7 = this;
        normalize_name(&local_50,this,&local_b0,false);
        get_isset_name(&local_110,ptVar7,&local_50);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") && ((!__isset.",0x10);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
        ptVar7 = this;
        normalize_name(&local_70,this,&local_f0,false);
        get_isset_name(&local_d0,ptVar7,&local_70);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") || (",6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      ptVar3 = (*pptVar9)->type_;
      iVar4 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xd])(ptVar3);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ptVar3->super_t_doc)._vptr_t_doc[7])(ptVar3);
        if ((char)iVar4 != '\0') goto LAB_002c1e3e;
        lVar6 = 0x15;
        pcVar8 = "System.Object.Equals(";
      }
      else {
LAB_002c1e3e:
        lVar6 = 0x14;
        pcVar8 = "TCollections.Equals(";
      }
      poVar5 = local_148;
      std::__ostream_insert<char,std::char_traits<char>>(local_148,pcVar8,lVar6);
      prop_name_abi_cxx11_(&local_168,this,*pptVar9,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", other.",8);
      prop_name_abi_cxx11_(&local_138,this,*pptVar9,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((*pptVar9)->req_ != T_REQUIRED) {
        std::__ostream_insert<char,std::char_traits<char>>(local_148,")))",3);
      }
      out = local_148;
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_118->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
    if ((local_13c & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_148,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      goto LAB_002c1fec;
    }
  }
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
LAB_002c1fec:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_168._M_dataplus._M_p,local_168._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_equals(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override bool Equals(object that)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << type_name(tstruct,false) << " other)) return false;" << endl
        << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;


    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool first = true;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
            out << indent() << "return ";
            indent_up();
        }
        else
        {
            out << endl;
            out << indent() << "&& ";
        }
        if (!field_is_required((*f_iter)))
        {
            out << "((__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << " == other.__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") && ((!__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") || (";
        }
        t_type* ttype = (*f_iter)->get_type();
        if (ttype->is_container() || ttype->is_binary())
        {
            out << "TCollections.Equals(";
        }
        else
        {
            out << "System.Object.Equals(";
        }
        out << prop_name((*f_iter)) << ", other." << prop_name((*f_iter)) << ")";
        if (!field_is_required((*f_iter)))
        {
            out << ")))";
        }
    }
    if (first)
    {
        out << indent() << "return true;" << endl;
    }
    else
    {
        out << ";" << endl;
        indent_down();
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}